

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData *
cfd::core::CryptoUtil::ConvertSignatureToDer
          (ByteData *__return_storage_ptr__,string *hex_string,SigHashType *sighash_type)

{
  ByteData local_38;
  SigHashType *local_20;
  SigHashType *sighash_type_local;
  string *hex_string_local;
  
  local_20 = sighash_type;
  sighash_type_local = (SigHashType *)hex_string;
  hex_string_local = (string *)__return_storage_ptr__;
  ByteData::ByteData(&local_38,(string *)hex_string);
  ConvertSignatureToDer(__return_storage_ptr__,&local_38,local_20);
  ByteData::~ByteData((ByteData *)0x3f0d4c);
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::ConvertSignatureToDer(
    const std::string &hex_string, const SigHashType &sighash_type) {
  return ConvertSignatureToDer(ByteData(hex_string), sighash_type);
}